

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O0

void Mpm_ManStop(Mpm_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  FILE *pFile;
  char *pFileName;
  Mpm_Man_t *p_local;
  
  if ((p->pPars->fUseTruth != 0) && (p->pPars->fVeryVerbose != 0)) {
    __stream = fopen("truths.txt","wb");
    Vec_MemDump((FILE *)__stream,p->vTtMem);
    fclose(__stream);
    uVar3 = Vec_MemEntryNum(p->vTtMem);
    uVar1 = p->nLutSize;
    iVar2 = p->nTruWords;
    iVar4 = Vec_MemEntryNum(p->vTtMem);
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (((double)iVar2 * 16.0 + 1.0) * (double)iVar4) / 1048576.0,(ulong)uVar3,(ulong)uVar1,
           "truths.txt");
  }
  if ((p->pPars->fUseDsd != 0) && (p->pPars->fVerbose != 0)) {
    Mpm_ManPrintDsdStats(p);
  }
  if (p->vTtMem != (Vec_Mem_t *)0x0) {
    Vec_MemHashFree(p->vTtMem);
    Vec_MemFree(p->vTtMem);
  }
  if (p->pHash != (Hsh_IntMan_t *)0x0) {
    Vec_WrdFree(p->vPerm6);
    Vec_IntFree(p->vMap2Perm);
    Vec_IntFree(p->vConfgRes);
    Vec_IntFree(p->pHash->vData);
    Hsh_IntManStop(p->pHash);
  }
  Vec_WecFreeP(&p->vNpnConfigs);
  Vec_PtrFree(p->vTemp);
  Mmr_StepStop(p->pManCuts);
  if ((p->vFreeUnits).pArray != (void **)0x0) {
    free((p->vFreeUnits).pArray);
    (p->vFreeUnits).pArray = (void **)0x0;
  }
  if ((p->vCutBests).pArray != (int *)0x0) {
    free((p->vCutBests).pArray);
    (p->vCutBests).pArray = (int *)0x0;
  }
  if ((p->vCutLists).pArray != (int *)0x0) {
    free((p->vCutLists).pArray);
    (p->vCutLists).pArray = (int *)0x0;
  }
  if ((p->vMigRefs).pArray != (int *)0x0) {
    free((p->vMigRefs).pArray);
    (p->vMigRefs).pArray = (int *)0x0;
  }
  if ((p->vMapRefs).pArray != (int *)0x0) {
    free((p->vMapRefs).pArray);
    (p->vMapRefs).pArray = (int *)0x0;
  }
  if ((p->vEstRefs).pArray != (int *)0x0) {
    free((p->vEstRefs).pArray);
    (p->vEstRefs).pArray = (int *)0x0;
  }
  if ((p->vRequireds).pArray != (int *)0x0) {
    free((p->vRequireds).pArray);
    (p->vRequireds).pArray = (int *)0x0;
  }
  if ((p->vTimes).pArray != (int *)0x0) {
    free((p->vTimes).pArray);
    (p->vTimes).pArray = (int *)0x0;
  }
  if ((p->vAreas).pArray != (int *)0x0) {
    free((p->vAreas).pArray);
    (p->vAreas).pArray = (int *)0x0;
  }
  if ((p->vEdges).pArray != (int *)0x0) {
    free((p->vEdges).pArray);
    (p->vEdges).pArray = (int *)0x0;
  }
  if (p != (Mpm_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Mpm_ManStop( Mpm_Man_t * p )
{
    if ( p->pPars->fUseTruth && p->pPars->fVeryVerbose )
    {
        char * pFileName = "truths.txt";
        FILE * pFile = fopen( pFileName, "wb" );
        Vec_MemDump( pFile, p->vTtMem );
        fclose( pFile );
        printf( "Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n", 
            Vec_MemEntryNum(p->vTtMem), p->nLutSize, pFileName,
            (16.0 * p->nTruWords + 1.0) * Vec_MemEntryNum(p->vTtMem) / (1 << 20) );
    }
    if ( p->pPars->fUseDsd && p->pPars->fVerbose )
        Mpm_ManPrintDsdStats( p );
    if ( p->vTtMem ) 
    {
        Vec_MemHashFree( p->vTtMem );
        Vec_MemFree( p->vTtMem );
    }
    if ( p->pHash )
    {
        Vec_WrdFree( p->vPerm6 );
        Vec_IntFree( p->vMap2Perm );
        Vec_IntFree( p->vConfgRes );
        Vec_IntFree( p->pHash->vData );
        Hsh_IntManStop( p->pHash );
    }
    Vec_WecFreeP( &p->vNpnConfigs );
    Vec_PtrFree( p->vTemp );
    Mmr_StepStop( p->pManCuts );
    ABC_FREE( p->vFreeUnits.pArray );
    // mapping attributes
    ABC_FREE( p->vCutBests.pArray );
    ABC_FREE( p->vCutLists.pArray );
    ABC_FREE( p->vMigRefs.pArray );
    ABC_FREE( p->vMapRefs.pArray );
    ABC_FREE( p->vEstRefs.pArray );
    ABC_FREE( p->vRequireds.pArray );
    ABC_FREE( p->vTimes.pArray );
    ABC_FREE( p->vAreas.pArray );
    ABC_FREE( p->vEdges.pArray );
    ABC_FREE( p );
}